

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O3

Abc_Cex_t *
Bmc_CexCareMinimizeAig
          (Gia_Man_t *p,int nRealPis,Abc_Cex_t *pCex,int nTryCexes,int fCheck,int fVerbose)

{
  Vec_Int_t *pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *vPriosIn;
  int *__ptr;
  Vec_Int_t *vPriosFf;
  int *piVar5;
  Abc_Cex_t *pAVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  Abc_Cex_t **p_00;
  uint uVar18;
  ulong uVar19;
  Abc_Cex_t *pCexMin [4];
  Abc_Cex_t *local_80;
  Abc_Cex_t *local_58 [5];
  
  local_58[2] = (Abc_Cex_t *)0x0;
  local_58[3] = (Abc_Cex_t *)0x0;
  local_58[0] = (Abc_Cex_t *)0x0;
  local_58[1] = (Abc_Cex_t *)0x0;
  iVar3 = pCex->nPis;
  iVar8 = p->nRegs;
  if (iVar3 == p->vCis->nSize - iVar8) {
    if (pCex->nRegs == iVar8) {
      if ((-1 < pCex->iPo) && (pCex->iPo < p->vCos->nSize - iVar8)) {
        if (fVerbose != 0) {
          printf("Original :    ");
          Bmc_CexPrint(pCex,nRealPis,0);
          iVar3 = pCex->nPis;
        }
        iVar8 = pCex->iFrame + 1;
        uVar18 = iVar3 * iVar8;
        vPriosIn = (Vec_Int_t *)malloc(0x10);
        if (uVar18 - 1 < 0xf) {
          uVar18 = 0x10;
        }
        uVar19 = (ulong)uVar18;
        vPriosIn->nSize = 0;
        vPriosIn->nCap = uVar18;
        if (uVar18 == 0) {
          __ptr = (int *)0x0;
        }
        else {
          __ptr = (int *)malloc((long)(int)uVar18 << 2);
        }
        vPriosIn->pArray = __ptr;
        iVar8 = iVar8 * pCex->nRegs;
        vPriosFf = (Vec_Int_t *)malloc(0x10);
        if (iVar8 - 1U < 0xf) {
          iVar8 = 0x10;
        }
        vPriosFf->nSize = 0;
        vPriosFf->nCap = iVar8;
        if (iVar8 == 0) {
          piVar5 = (int *)0x0;
        }
        else {
          piVar5 = (int *)malloc((long)iVar8 << 2);
        }
        vPriosFf->pArray = piVar5;
        uVar9 = (ulong)(uint)nTryCexes;
        if (0 < nTryCexes) {
          uVar7 = 0;
          do {
            uVar10 = ((long)pCex->iFrame + 1) * (long)pCex->nPis;
            iVar3 = (int)uVar10;
            if ((int)uVar19 < iVar3) {
              if (__ptr == (int *)0x0) {
                __ptr = (int *)malloc(uVar10 * 4);
              }
              else {
                __ptr = (int *)realloc(__ptr,uVar10 * 4);
              }
              vPriosIn->pArray = __ptr;
              if (__ptr == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              vPriosIn->nCap = iVar3;
              uVar19 = uVar10 & 0xffffffff;
            }
            if (0 < iVar3) {
              memset(__ptr,0,(uVar10 & 0xffffffff) << 2);
            }
            vPriosIn->nSize = iVar3;
            iVar8 = (int)uVar7;
            if (uVar7 == 0) {
              if (pCex->iFrame < 0) goto LAB_00581cae;
              pVVar1 = p->vCis;
              iVar8 = 0;
              iVar4 = pCex->iFrame;
              do {
                iVar11 = pVVar1->nSize;
                iVar12 = iVar8;
                if (nRealPis < iVar11 - p->nRegs) {
                  iVar14 = iVar8 * 2;
                  iVar11 = ~p->nRegs + iVar11;
                  do {
                    if (iVar8 < 0) goto LAB_00581f5e;
                    iVar15 = pCex->nPis * iVar4;
                    uVar18 = iVar11 + iVar15;
                    if (((int)uVar18 < 0) || (iVar3 <= (int)uVar18)) goto LAB_00581f3f;
                    uVar16 = iVar15 + pCex->nRegs + iVar11;
                    __ptr[uVar18] =
                         iVar14 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar16 >> 5] >> (uVar16 & 0x1f)
                                         & 1) != 0);
                    iVar14 = iVar14 + 2;
                    iVar12 = iVar12 + 1;
                    bVar2 = nRealPis < iVar11;
                    iVar11 = iVar11 + -1;
                  } while (bVar2);
                }
                iVar8 = iVar12;
                bVar2 = 0 < iVar4;
                iVar4 = iVar4 + -1;
              } while (bVar2);
              iVar4 = pCex->iFrame;
              if (-1 < pCex->iFrame) {
                do {
                  iVar11 = iVar8;
                  if (0 < nRealPis) {
                    iVar12 = iVar8 * 2;
                    iVar14 = nRealPis + -1;
                    do {
                      if (iVar8 < 0) goto LAB_00581f5e;
                      iVar15 = pCex->nPis * iVar4;
                      uVar18 = iVar14 + iVar15;
                      if (((int)uVar18 < 0) || (iVar3 <= (int)uVar18)) goto LAB_00581f3f;
                      uVar16 = iVar15 + pCex->nRegs + iVar14;
                      __ptr[uVar18] =
                           iVar12 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar16 >> 5] >>
                                            (uVar16 & 0x1f) & 1) != 0);
                      iVar12 = iVar12 + 2;
                      uVar18 = iVar14 + 1;
                      iVar11 = iVar11 + 1;
                      iVar14 = iVar14 + -1;
                    } while (1 < uVar18);
                  }
                  iVar8 = iVar11;
                  bVar2 = 0 < iVar4;
                  iVar4 = iVar4 + -1;
                } while (bVar2);
              }
            }
            else if (iVar8 == 3) {
              if (pCex->iFrame < 0) goto LAB_00581cae;
              pVVar1 = p->vCis;
              iVar4 = p->nRegs;
              iVar11 = pVVar1->nSize;
              iVar12 = 0;
              iVar14 = pCex->iFrame;
              do {
                iVar8 = iVar12;
                if (nRealPis < iVar11 - iVar4) {
                  iVar15 = iVar12 * 2;
                  iVar17 = nRealPis;
                  do {
                    if (iVar12 < 0) goto LAB_00581f5e;
                    iVar4 = pCex->nPis * iVar14;
                    uVar18 = iVar17 + iVar4;
                    if (((int)uVar18 < 0) || (iVar3 <= (int)uVar18)) goto LAB_00581f3f;
                    uVar16 = iVar4 + pCex->nRegs + iVar17;
                    __ptr[uVar18] =
                         iVar15 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar16 >> 5] >> (uVar16 & 0x1f)
                                         & 1) != 0);
                    iVar17 = iVar17 + 1;
                    iVar4 = p->nRegs;
                    iVar11 = pVVar1->nSize;
                    iVar15 = iVar15 + 2;
                    iVar8 = iVar8 + 1;
                  } while (iVar17 < iVar11 - iVar4);
                }
                bVar2 = 0 < iVar14;
                iVar12 = iVar8;
                iVar14 = iVar14 + -1;
              } while (bVar2);
              iVar4 = pCex->iFrame;
              if (-1 < pCex->iFrame) {
                do {
                  if (0 < nRealPis) {
                    iVar11 = iVar8 * 2;
                    iVar12 = 0;
                    do {
                      if (iVar8 < 0) goto LAB_00581f5e;
                      iVar14 = pCex->nPis * iVar4;
                      uVar18 = iVar12 + iVar14;
                      if (((int)uVar18 < 0) || (iVar3 <= (int)uVar18)) goto LAB_00581f3f;
                      uVar16 = iVar14 + pCex->nRegs + iVar12;
                      __ptr[uVar18] =
                           iVar11 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar16 >> 5] >>
                                            (uVar16 & 0x1f) & 1) != 0);
                      iVar12 = iVar12 + 1;
                      iVar11 = iVar11 + 2;
                    } while (nRealPis != iVar12);
                    iVar8 = iVar8 + iVar12;
                  }
                  bVar2 = 0 < iVar4;
                  iVar4 = iVar4 + -1;
                } while (bVar2);
              }
            }
            else if (iVar8 == 2) {
              if (pCex->iFrame < 0) goto LAB_00581cae;
              pVVar1 = p->vCis;
              iVar4 = p->nRegs;
              iVar11 = pVVar1->nSize;
              iVar12 = 0;
              iVar14 = pCex->iFrame;
              do {
                iVar8 = iVar12;
                if (nRealPis < iVar11 - iVar4) {
                  iVar15 = iVar12 * 2;
                  iVar17 = nRealPis;
                  do {
                    if (iVar12 < 0) goto LAB_00581f5e;
                    iVar4 = pCex->nPis * iVar14;
                    uVar18 = iVar17 + iVar4;
                    if (((int)uVar18 < 0) || (iVar3 <= (int)uVar18)) goto LAB_00581f3f;
                    uVar16 = iVar4 + pCex->nRegs + iVar17;
                    __ptr[uVar18] =
                         iVar15 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar16 >> 5] >> (uVar16 & 0x1f)
                                         & 1) != 0);
                    iVar17 = iVar17 + 1;
                    iVar4 = p->nRegs;
                    iVar11 = pVVar1->nSize;
                    iVar15 = iVar15 + 2;
                    iVar8 = iVar8 + 1;
                  } while (iVar17 < iVar11 - iVar4);
                }
                bVar2 = 0 < iVar14;
                iVar12 = iVar8;
                iVar14 = iVar14 + -1;
              } while (bVar2);
              iVar4 = iVar8;
              iVar11 = pCex->iFrame;
              if (-1 < pCex->iFrame) {
                do {
                  iVar8 = iVar4;
                  if (0 < nRealPis) {
                    iVar12 = iVar4 * 2;
                    iVar14 = nRealPis + -1;
                    do {
                      if (iVar4 < 0) goto LAB_00581f5e;
                      iVar15 = pCex->nPis * iVar11;
                      uVar18 = iVar14 + iVar15;
                      if (((int)uVar18 < 0) || (iVar3 <= (int)uVar18)) goto LAB_00581f3f;
                      uVar16 = iVar15 + pCex->nRegs + iVar14;
                      __ptr[uVar18] =
                           iVar12 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar16 >> 5] >>
                                            (uVar16 & 0x1f) & 1) != 0);
                      iVar12 = iVar12 + 2;
                      uVar18 = iVar14 + 1;
                      iVar8 = iVar8 + 1;
                      iVar14 = iVar14 + -1;
                    } while (1 < uVar18);
                  }
                  bVar2 = 0 < iVar11;
                  iVar4 = iVar8;
                  iVar11 = iVar11 + -1;
                } while (bVar2);
              }
            }
            else {
              if (iVar8 != 1) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcCexCare.c"
                              ,0x16c,
                              "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                             );
              }
              if (pCex->iFrame < 0) {
LAB_00581cae:
                iVar8 = 0;
              }
              else {
                pVVar1 = p->vCis;
                iVar8 = 0;
                iVar4 = pCex->iFrame;
                do {
                  iVar11 = pVVar1->nSize;
                  iVar12 = iVar8;
                  if (nRealPis < iVar11 - p->nRegs) {
                    iVar14 = iVar8 * 2;
                    iVar11 = ~p->nRegs + iVar11;
                    do {
                      if (iVar8 < 0) goto LAB_00581f5e;
                      iVar15 = pCex->nPis * iVar4;
                      uVar18 = iVar11 + iVar15;
                      if (((int)uVar18 < 0) || (iVar3 <= (int)uVar18)) goto LAB_00581f3f;
                      uVar16 = iVar15 + pCex->nRegs + iVar11;
                      __ptr[uVar18] =
                           iVar14 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar16 >> 5] >>
                                            (uVar16 & 0x1f) & 1) != 0);
                      iVar14 = iVar14 + 2;
                      iVar12 = iVar12 + 1;
                      bVar2 = nRealPis < iVar11;
                      iVar11 = iVar11 + -1;
                    } while (bVar2);
                  }
                  iVar8 = iVar12;
                  bVar2 = 0 < iVar4;
                  iVar4 = iVar4 + -1;
                } while (bVar2);
                iVar4 = pCex->iFrame;
                if (-1 < pCex->iFrame) {
                  do {
                    if (0 < nRealPis) {
                      iVar11 = iVar8 * 2;
                      iVar12 = 0;
                      do {
                        if (iVar8 < 0) {
LAB_00581f5e:
                          __assert_fail("Var >= 0 && !(c >> 1)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                        ,0x12e,"int Abc_Var2Lit(int, int)");
                        }
                        iVar14 = pCex->nPis * iVar4;
                        uVar18 = iVar12 + iVar14;
                        if (((int)uVar18 < 0) || (iVar3 <= (int)uVar18)) {
LAB_00581f3f:
                          __assert_fail("i >= 0 && i < p->nSize",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                        }
                        uVar16 = iVar14 + pCex->nRegs + iVar12;
                        __ptr[uVar18] =
                             iVar11 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar16 >> 5] >>
                                              (uVar16 & 0x1f) & 1) != 0);
                        iVar12 = iVar12 + 1;
                        iVar11 = iVar11 + 2;
                      } while (nRealPis != iVar12);
                      iVar8 = iVar8 + iVar12;
                    }
                    bVar2 = 0 < iVar4;
                    iVar4 = iVar4 + -1;
                  } while (bVar2);
                }
              }
            }
            if (iVar8 != (pCex->iFrame + 1) * pCex->nPis) {
              __assert_fail("Counter == pCex->nPis * (pCex->iFrame + 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcCexCare.c"
                            ,0x16e,
                            "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                           );
            }
            Bmc_CexCarePropagateFwd(p,pCex,vPriosIn,vPriosFf);
            if (vPriosFf->nSize != (pCex->iFrame + 1) * pCex->nRegs) {
              __assert_fail("Vec_IntSize(vPriosFf) == pCex->nRegs * (pCex->iFrame + 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcCexCare.c"
                            ,0x170,
                            "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                           );
            }
            uVar18 = pCex->iPo;
            iVar3 = p->vCos->nSize;
            if (iVar3 - p->nRegs <= (int)uVar18) {
              __assert_fail("v < Gia_ManPoNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
            }
            if (((int)uVar18 < 0) || (iVar3 <= (int)uVar18)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar3 = p->vCos->pArray[uVar18];
            if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar18 = p->pObjs[iVar3].Value;
            if ((int)uVar18 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            if ((uVar18 & 1) == 0) {
              puts("Counter-example is invalid.");
              if (__ptr != (int *)0x0) {
                free(__ptr);
              }
              free(vPriosIn);
              if (vPriosFf->pArray != (int *)0x0) {
                free(vPriosFf->pArray);
              }
              free(vPriosFf);
              return (Abc_Cex_t *)0x0;
            }
            pAVar6 = Bmc_CexCarePropagateBwd(p,pCex,vPriosIn,vPriosFf);
            local_58[uVar7] = pAVar6;
            if (fVerbose != 0) {
              pcVar13 = "PI-  PPI-:    ";
              if (uVar7 != 0) {
                if (3 < uVar7) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcCexCare.c"
                                ,0x183,
                                "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                               );
                }
                pcVar13 = &DAT_00a05c20 +
                          *(int *)(&DAT_00a05c20 + ((long)((uVar7 << 0x20) + -0x100000000) >> 0x1e))
                ;
              }
              printf(pcVar13);
              Bmc_CexPrint(pAVar6,nRealPis,0);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar9);
        }
        if (__ptr != (int *)0x0) {
          free(__ptr);
        }
        free(vPriosIn);
        if (vPriosFf->pArray != (int *)0x0) {
          free(vPriosFf->pArray);
        }
        free(vPriosFf);
        local_80 = local_58[0];
        iVar3 = Abc_CexCountOnes(local_58[0]);
        if (1 < nTryCexes) {
          uVar19 = 1;
          do {
            pAVar6 = local_58[uVar19];
            if (pAVar6 != (Abc_Cex_t *)0x0) {
              iVar4 = Abc_CexCountOnes(pAVar6);
              iVar8 = iVar3;
              if (iVar4 <= iVar3) {
                iVar8 = iVar4;
              }
              bVar2 = iVar4 < iVar3;
              iVar3 = iVar8;
              if (bVar2) {
                local_80 = pAVar6;
              }
            }
            uVar19 = uVar19 + 1;
          } while (uVar9 != uVar19);
        }
        if (fVerbose != 0) {
          printf("Final    :    ");
          Bmc_CexPrint(local_80,nRealPis,0);
        }
        if (0 < nTryCexes) {
          p_00 = local_58;
          do {
            if ((*p_00 != (Abc_Cex_t *)0x0) && (local_80 != *p_00)) {
              Abc_CexFreeP(p_00);
            }
            p_00 = p_00 + 1;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        iVar3 = Bmc_CexVerify(p,pCex,local_80);
        if (iVar3 == 0) {
          pcVar13 = "Counter-example verification has failed.";
        }
        else {
          if (fCheck == 0) {
            return local_80;
          }
          pcVar13 = "Counter-example verification succeeded.";
        }
        puts(pcVar13);
        return local_80;
      }
      pcVar13 = "Given CEX has PO whose index is out of range for the AIG.";
    }
    else {
      pcVar13 = "Given CEX does to have same number of flops as the AIG.";
    }
  }
  else {
    pcVar13 = "Given CEX does to have same number of inputs as the AIG.";
  }
  puts(pcVar13);
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Bmc_CexCareMinimizeAig( Gia_Man_t * p, int nRealPis, Abc_Cex_t * pCex, int nTryCexes, int fCheck, int fVerbose )
{
    //int nTryCexes = 4; // belongs to range [1;4]
    Abc_Cex_t * pCexBest, * pCexMin[4] = {NULL};
    int k, f, i, nOnesBest, nOnesCur, Counter = 0;
    Vec_Int_t * vPriosIn, * vPriosFf;
    if ( pCex->nPis != Gia_ManPiNum(p) )
    {
        printf( "Given CEX does to have same number of inputs as the AIG.\n" );
        return NULL;
    }
    if ( pCex->nRegs != Gia_ManRegNum(p) )
    {
        printf( "Given CEX does to have same number of flops as the AIG.\n" );
        return NULL;
    }
    if ( !(pCex->iPo >= 0 && pCex->iPo < Gia_ManPoNum(p)) )
    {
        printf( "Given CEX has PO whose index is out of range for the AIG.\n" );
        return NULL;
    }
    assert( pCex->nPis == Gia_ManPiNum(p) );
    assert( pCex->nRegs == Gia_ManRegNum(p) );
    assert( pCex->iPo >= 0 && pCex->iPo < Gia_ManPoNum(p) );
    if ( fVerbose )
    {
        printf( "Original :    " );
        Bmc_CexPrint( pCex, nRealPis, 0 );
    }
    vPriosIn = Vec_IntAlloc( pCex->nPis  * (pCex->iFrame + 1) );
    vPriosFf = Vec_IntAlloc( pCex->nRegs * (pCex->iFrame + 1) );
    for ( k = 0; k < nTryCexes; k++ )
    {
        Counter = 0;
        Vec_IntFill( vPriosIn, pCex->nPis * (pCex->iFrame + 1), 0 );
/*
        if ( k == 0 )
        {
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 1 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 2 )
        {
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 3 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else assert( 0 );
*/
        if ( k == 0 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 1 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 2 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 3 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else assert( 0 );

        assert( Counter == pCex->nPis * (pCex->iFrame + 1) );
        Bmc_CexCarePropagateFwd( p, pCex, vPriosIn, vPriosFf );
        assert( Vec_IntSize(vPriosFf) == pCex->nRegs * (pCex->iFrame + 1) );
        if ( !Abc_LitIsCompl(Gia_ManPo(p, pCex->iPo)->Value) )
        {
            printf( "Counter-example is invalid.\n" );
            Vec_IntFree( vPriosIn );
            Vec_IntFree( vPriosFf );
            return NULL;
        }
        pCexMin[k] = Bmc_CexCarePropagateBwd( p, pCex, vPriosIn, vPriosFf );
        if ( fVerbose )
        {
            if ( k == 0 )
                printf( "PI-  PPI-:    " );
            else if ( k == 1 )
                printf( "PI+  PPI-:    " );
            else if ( k == 2 )
                printf( "PI-  PPI+:    " );
            else if ( k == 3 )
                printf( "PI+  PPI+:    " );
            else assert( 0 );
            Bmc_CexPrint( pCexMin[k], nRealPis, 0 );
        }
    }
    Vec_IntFree( vPriosIn );
    Vec_IntFree( vPriosFf );
    // select the best one
    pCexBest  = pCexMin[0];
    nOnesBest = Abc_CexCountOnes(pCexMin[0]);
    for ( k = 1; k < nTryCexes; k++ )
    {
        if ( pCexMin[k] == NULL )
            continue;
        nOnesCur = Abc_CexCountOnes(pCexMin[k]);
        if ( nOnesBest > nOnesCur )
        {
            nOnesBest = nOnesCur;
            pCexBest  = pCexMin[k];
        }
    }
    if ( fVerbose )
    {
        //Abc_Cex_t * pTotal = Bmc_CexCareTotal( pCexMin, nTryCexes );
        printf( "Final    :    " );
        Bmc_CexPrint( pCexBest, nRealPis, 0 );
        //printf( "Total    :    " );
        //Bmc_CexPrint( pTotal, nRealPis, 0 );
        //Abc_CexFreeP( &pTotal );
    }
    for ( k = 0; k < nTryCexes; k++ )
        if ( pCexMin[k] && pCexBest != pCexMin[k] )
            Abc_CexFreeP( &pCexMin[k] );
    // verify and return
    if ( !Bmc_CexVerify( p, pCex, pCexBest ) )
        printf( "Counter-example verification has failed.\n" );
    else if ( fCheck ) 
        printf( "Counter-example verification succeeded.\n" );
    return pCexBest;
}